

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance> *this,
          Context *context)

{
  Context **this_00;
  Context **this_01;
  ChannelOrder CVar1;
  Context *__first;
  deUint32 dVar2;
  deUint32 dVar3;
  TestInstance *pTVar4;
  TestTexture2D *this_02;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  FilterCase *__result;
  Context *pCVar8;
  allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase> *__alloc;
  FilterCase *__args;
  FilterCase *pFVar9;
  FilterCase *extraout_RDX;
  allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase> *paVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ChannelOrder CVar14;
  int iVar15;
  int levelNdx;
  bool bVar16;
  Vector<float,_2> local_150;
  float local_144;
  float local_140;
  RGBA local_13c;
  FilterCase local_138;
  float local_118;
  TestInstance *local_100;
  Vec4 local_f8;
  undefined1 local_e8 [16];
  undefined8 uStack_d8;
  int local_d0;
  int local_cc;
  void *local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  ChannelType local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  int local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined8 local_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  float local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pTVar4 = (TestInstance *)operator_new(0x288);
  pTVar4->m_context = context;
  pTVar4->_vptr_TestInstance = (_func_int **)&PTR__Texture2DShadowTestInstance_00c0c760;
  pTVar4[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar4[1].m_context;
  local_100 = pTVar4 + 3;
  this_01 = &pTVar4[4].m_context;
  pTVar4[1].m_context = (Context *)0x0;
  pTVar4[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar4[2].m_context = (Context *)0x0;
  pTVar4[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar4[3].m_context = (Context *)0x0;
  pTVar4[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            ((TextureRenderer *)this_01,context,
             (this->m_testsParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,0x40,0x40);
  *(undefined4 *)&pTVar4[0x28]._vptr_TestInstance = 0;
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
             *)this_00,2);
  iVar11 = 2;
  while (bVar16 = iVar11 != 0, iVar11 = iVar11 + -1, bVar16) {
    this_02 = (TestTexture2D *)operator_new(0x70);
    local_138._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar4[1]._vptr_TestInstance + 3));
    vkt::pipeline::TestTexture2D::TestTexture2D
              (this_02,(TextureFormat *)&local_138,*(int *)(pTVar4[1]._vptr_TestInstance + 7),
               *(int *)((long)pTVar4[1]._vptr_TestInstance + 0x3c));
    de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr
              ((SharedPtr<vkt::pipeline::TestTexture2D> *)local_e8,this_02);
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTexture2D>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTexture2D> *)local_e8);
    de::SharedPtr<vkt::pipeline::TestTexture2D>::~SharedPtr
              ((SharedPtr<vkt::pipeline::TestTexture2D> *)local_e8);
  }
  local_118 = (float)(*(code *)(*this_00)->m_testCtx->m_platform[2]._vptr_Platform)();
  iVar15 = 0;
  iVar11 = (int)local_118;
  if ((int)local_118 < 1) {
    iVar11 = 0;
  }
  for (; iVar11 != iVar15; iVar15 = iVar15 + 1) {
    (*(code *)(*this_00)->m_testCtx->m_platform[7]._vptr_Platform)
              ((PixelBufferAccess *)local_e8,(*this_00)->m_testCtx,iVar15);
    local_138.textureIndex = 0xbf000000;
    local_138.minCoord.m_data[0] = -0.5;
    local_138.minCoord.m_data[1] = -0.5;
    local_138.maxCoord.m_data[0] = 2.0;
    local_f8.m_data._0_8_ = &DAT_3f8000003f800000;
    local_f8.m_data[2] = 1.0;
    local_f8.m_data[3] = 0.0;
    tcu::fillWithComponentGradients((PixelBufferAccess *)local_e8,(Vec4 *)&local_138,&local_f8);
  }
  for (iVar15 = 0; iVar11 != iVar15; iVar15 = iVar15 + 1) {
    lVar13 = (long)(int)local_118;
    (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x38))
              (local_e8,(*this_00)->m_progCollection,iVar15,0);
    uVar12 = (int)(0xffffff / lVar13) * iVar15;
    local_150.m_data = (float  [2])(CONCAT44(local_150.m_data[1],uVar12) | 0xff000000);
    tcu::RGBA::toVec((RGBA *)&local_150);
    local_13c.m_value = ~uVar12 | 0xff000000;
    tcu::RGBA::toVec(&local_13c);
    tcu::fillWithGrid((PixelBufferAccess *)local_e8,4,(Vec4 *)&local_138,&local_f8);
  }
  for (pCVar8 = pTVar4[1].m_context; pCVar8 != (Context *)pTVar4[2]._vptr_TestInstance;
      pCVar8 = (Context *)&pCVar8->m_progCollection) {
    TextureRenderer::add2DTexture((TextureRenderer *)this_01,(TestTexture2DSp *)pCVar8);
  }
  local_cc = 0;
  bVar16 = *(int *)(pTVar4[1]._vptr_TestInstance + 8) - 5U < 2;
  if (!bVar16) {
    local_cc = 0x3f000000;
  }
  local_e8._0_4_ = R;
  local_e8._4_4_ = *(ChannelType *)(&DAT_009f1e10 + (ulong)bVar16 * 4);
  local_e8._8_8_ = (SharedPtrStateBase *)0x4039999a3fcccccd;
  uStack_d8._0_4_ = -0x40800000;
  uStack_d8._4_4_ = -0x3fd33333;
  local_d0 = 0;
  local_c8 = (void *)0xbfaccccdc0000000;
  uStack_c0 = 0x3f333333be4ccccd;
  local_b8 = 1;
  local_b4 = *(ChannelType *)(&DAT_009f1e10 + (ulong)bVar16 * 4);
  local_b0 = 0x3e8ccccd3e0f5c29;
  uStack_a8 = 0xbf8ccccdbfc00000;
  local_a0 = 1;
  local_9c = local_cc;
  local_98 = 0xc028f5c3bf6b851f;
  uStack_90 = 0xbdcccccd3ecccccd;
  local_88 = 1;
  local_84 = 0xbec7ae143f8ccccd;
  uStack_7c = 0x3f266666bf051eb8;
  local_74 = 0x13f5eb852;
  local_6c = 0xbfc66666bdcccccd;
  uStack_64 = 0x3eb333333f266666;
  local_5c = 0x3f68f5c3;
  lVar13 = 0x10;
  do {
    if (lVar13 == 0xa0) {
      *(undefined4 *)&pTVar4[0x28]._vptr_TestInstance = 0;
      return pTVar4;
    }
    CVar1 = *(ChannelOrder *)((long)local_f8.m_data + lVar13);
    CVar14 = (int)((ulong)((long)pTVar4[2]._vptr_TestInstance - (long)pTVar4[1].m_context) >> 4) - A
    ;
    if ((int)CVar1 < (int)CVar14) {
      CVar14 = CVar1;
    }
    if ((int)CVar1 < 0) {
      CVar14 = R;
    }
    local_140 = *(float *)((long)local_f8.m_data + lVar13 + 4);
    local_118 = *(float *)((long)local_f8.m_data + lVar13 + 0xc);
    local_48 = *(undefined1 **)(local_e8 + lVar13);
    uStack_40 = 0;
    local_58 = deFloatExp2(*(float *)((long)local_f8.m_data + lVar13 + 8));
    dVar2 = TextureRenderer::getRenderWidth((TextureRenderer *)this_01);
    lVar5 = (*(code *)(&(*this_00)->m_testCtx)[(long)(int)CVar14 * 2]->m_platform[0x11].
                      _vptr_Platform)();
    local_144 = (float)*(int *)(lVar5 + 0x38);
    local_118 = deFloatExp2(local_118);
    dVar3 = TextureRenderer::getRenderHeight((TextureRenderer *)this_01);
    lVar5 = (*(code *)(&(*this_00)->m_testCtx)[(long)(int)CVar14 * 2]->m_platform[0x11].
                      _vptr_Platform)();
    local_f8.m_data._0_8_ = local_48;
    local_150.m_data[1] =
         (local_118 * (float)dVar3) / (float)*(int *)(lVar5 + 0x3c) + local_48._4_4_;
    local_150.m_data[0] = (local_58 * (float)dVar2) / local_144 + (float)local_48;
    local_138.textureIndex = CVar14;
    tcu::Vector<float,_2>::Vector
              ((Vector<float,_2> *)((long)&local_138 + 4),(Vector<float,_2> *)&local_f8);
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)((long)&local_138 + 0xc),&local_150);
    local_138.ref = local_140;
    pCVar8 = pTVar4[3].m_context;
    if (pCVar8 == (Context *)pTVar4[4]._vptr_TestInstance) {
      __first = (Context *)local_100->_vptr_TestInstance;
      lVar5 = (long)pCVar8 - (long)__first;
      if (lVar5 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar6 = lVar5 / 0x18;
      pFVar9 = (FilterCase *)(lVar5 % 0x18);
      uVar7 = uVar6;
      if (pCVar8 == __first) {
        uVar7 = 1;
      }
      __alloc = (allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>
                 *)(uVar7 + uVar6);
      if ((allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase> *
          )0x555555555555554 < __alloc) {
        __alloc = (allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>
                   *)0x555555555555555;
      }
      paVar10 = (allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>
                 *)0x555555555555555;
      if (!CARRY8(uVar7,uVar6)) {
        paVar10 = __alloc;
      }
      if (paVar10 ==
          (allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase> *
          )0x0) {
        __result = (FilterCase *)0x0;
      }
      else {
        __result = (FilterCase *)operator_new((long)paVar10 * 0x18);
        pFVar9 = extraout_RDX;
      }
      std::
      allocator_traits<std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>>
      ::
      construct<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>
                ((allocator_type *)(__result + uVar6),&local_138,pFVar9);
      pFVar9 = std::
               __uninitialized_move_if_noexcept_a<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase*,vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase*,std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>>
                         ((FilterCase *)__first,(FilterCase *)pCVar8,__result,__alloc);
      pCVar8 = (Context *)
               std::
               __uninitialized_move_if_noexcept_a<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase*,vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase*,std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>>
                         ((FilterCase *)pCVar8,(FilterCase *)pCVar8,pFVar9 + 1,__alloc);
      lVar5 = (long)pTVar4[4]._vptr_TestInstance - (long)__first;
      std::
      _Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
      ::_M_deallocate((_Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
                       *)__first,(pointer)(lVar5 / 0x18),lVar5 % 0x18);
      pTVar4[3]._vptr_TestInstance = (_func_int **)__result;
      pTVar4[3].m_context = pCVar8;
      pTVar4[4]._vptr_TestInstance = (_func_int **)(__result + (long)paVar10);
    }
    else {
      std::
      allocator_traits<std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>>
      ::
      construct<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>
                ((allocator_type *)pCVar8,&local_138,__args);
      pTVar4[3].m_context = (Context *)&(pTVar4[3].m_context)->m_device;
    }
    lVar13 = lVar13 + 0x18;
  } while( true );
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}